

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

h__TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::ReadAncillaryResource
          (h__TextParser *this,byte_t *uuid,FrameBuffer *FrameBuf,IResourceResolver *Resolver)

{
  bool bVar1;
  int iVar2;
  ILogSink *this_00;
  char *pcVar3;
  reference ppVar4;
  undefined8 in_R8;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_bd;
  undefined4 local_bc;
  _Self local_b8 [3];
  _Self local_a0;
  const_iterator rmi;
  char buf [64];
  undefined1 local_50 [8];
  UUID TmpID;
  IResourceResolver *Resolver_local;
  FrameBuffer *FrameBuf_local;
  byte_t *uuid_local;
  h__TextParser *this_local;
  Result_t *result;
  
  TmpID.super_Identifier<16U>._24_8_ = in_R8;
  ASDCP::TimedText::FrameBuffer::AssetID((FrameBuffer *)Resolver,(byte_t *)FrameBuf);
  Kumu::UUID::UUID((UUID *)local_50,(byte_t *)FrameBuf);
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
       ::find((map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
               *)(uuid + 0x80),(UUID *)local_50);
  local_b8[0]._M_node =
       (_Base_ptr)
       std::
       map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
       ::end((map<Kumu::UUID,_ASDCP::TimedText::MIMEType_t,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>_>
              *)(uuid + 0x80));
  bVar1 = std::operator==(&local_a0,local_b8);
  if (bVar1) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar3 = Kumu::UUID::EncodeHex((UUID *)local_50,(char *)&rmi,0x40);
    Kumu::ILogSink::Error(this_00,"Unknown ancillary resource id: %s\n",pcVar3);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
  }
  else {
    local_bd = 0;
    (**(code **)(*(long *)TmpID.super_Identifier<16U>._24_8_ + 0x10))
              (this,TmpID.super_Identifier<16U>._24_8_,FrameBuf);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>::
               operator*(&local_a0);
      if (ppVar4->second == MT_PNG) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"image/png",&local_e1);
        ASDCP::TimedText::FrameBuffer::MIMEType((FrameBuffer *)Resolver,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
      }
      else {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t>_>
                 ::operator*(&local_a0);
        if (ppVar4->second == MT_OPENTYPE) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"application/x-font-opentype",&local_109);
          ASDCP::TimedText::FrameBuffer::MIMEType((FrameBuffer *)Resolver,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::allocator<char>::~allocator(&local_109);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"application/octet-stream",&local_131);
          ASDCP::TimedText::FrameBuffer::MIMEType((FrameBuffer *)Resolver,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
        }
      }
    }
    local_bd = 1;
  }
  local_bc = 1;
  Kumu::UUID::~UUID((UUID *)local_50);
  return this;
}

Assistant:

Result_t
AS_02::TimedText::ST2052_TextParser::h__TextParser::ReadAncillaryResource(const byte_t* uuid, ASDCP::TimedText::FrameBuffer& FrameBuf,
									  const ASDCP::TimedText::IResourceResolver& Resolver) const
{
  FrameBuf.AssetID(uuid);
  UUID TmpID(uuid);
  char buf[64];

  ResourceTypeMap_t::const_iterator rmi = m_ResourceTypes.find(TmpID);

  if ( rmi == m_ResourceTypes.end() )
    {
      DefaultLogSink().Error("Unknown ancillary resource id: %s\n", TmpID.EncodeHex(buf, 64));
      return RESULT_RANGE;
    }

  Result_t result = Resolver.ResolveRID(uuid, FrameBuf);

  if ( KM_SUCCESS(result) )
    {
      if ( (*rmi).second == ASDCP::TimedText::MT_PNG )
	{
	  FrameBuf.MIMEType("image/png");
	}    
      else if ( (*rmi).second == ASDCP::TimedText::MT_OPENTYPE )
	{
	  FrameBuf.MIMEType("application/x-font-opentype");
	}
      else
	{
	  FrameBuf.MIMEType("application/octet-stream");
	}
    }

  return result;
}